

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall aiNode::~aiNode(aiNode *this)

{
  aiNode *this_00;
  aiMetadata *this_01;
  uint uVar1;
  aiNode **ppaVar2;
  uint a;
  ulong uVar3;
  
  ppaVar2 = this->mChildren;
  if (ppaVar2 != (aiNode **)0x0) {
    uVar1 = this->mNumChildren;
    if (uVar1 != 0) {
      for (uVar3 = 0; ppaVar2 = this->mChildren, uVar3 < uVar1; uVar3 = uVar3 + 1) {
        this_00 = ppaVar2[uVar3];
        if (this_00 != (aiNode *)0x0) {
          ~aiNode(this_00);
        }
        operator_delete(this_00);
        uVar1 = this->mNumChildren;
      }
      if (ppaVar2 == (aiNode **)0x0) goto LAB_003a29c1;
    }
    operator_delete__(ppaVar2);
  }
LAB_003a29c1:
  if (this->mMeshes != (uint *)0x0) {
    operator_delete__(this->mMeshes);
  }
  this_01 = this->mMetaData;
  if (this_01 != (aiMetadata *)0x0) {
    aiMetadata::~aiMetadata(this_01);
  }
  operator_delete(this_01);
  return;
}

Assistant:

aiNode::~aiNode() {
    // delete all children recursively
    // to make sure we won't crash if the data is invalid ...
    if (mChildren && mNumChildren)
    {
        for (unsigned int a = 0; a < mNumChildren; a++)
            delete mChildren[a];
    }
    delete[] mChildren;
    delete[] mMeshes;
    delete mMetaData;
}